

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O0

BreakpointProbe * __thiscall
Js::DebugDocument::FindBreakpoint(DebugDocument *this,StatementLocation statement)

{
  anon_class_16_2_e051e28a map;
  BreakpointProbe *local_18;
  BreakpointProbe *probe;
  DebugDocument *this_local;
  
  local_18 = (BreakpointProbe *)0x0;
  if (this->m_breakpointList != (BreakpointProbeList *)0x0) {
    map.probe = &local_18;
    map.statement = &statement;
    probe = (BreakpointProbe *)this;
    JsUtil::
    List<Js::BreakpointProbe*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
    MapUntil<Js::DebugDocument::FindBreakpoint(Js::StatementLocation)::__0>
              ((List<Js::BreakpointProbe*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)this->m_breakpointList,map);
  }
  return local_18;
}

Assistant:

Js::BreakpointProbe* DebugDocument::FindBreakpoint(StatementLocation statement)
    {
        Js::BreakpointProbe* probe = nullptr;
        if (m_breakpointList != nullptr)
        {
            m_breakpointList->MapUntil([&](int index, BreakpointProbe* bpProbe) -> bool
            {
                if (bpProbe != nullptr && bpProbe->Matches(statement))
                {
                    probe = bpProbe;
                    return true;
                }
                return false;
            });
        }

        return probe;
    }